

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int ncnn::gemm_AT_x86(Mat *AT,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int M,int K,
                     int transB,int output_transpose,int constant_TILE_M,int constant_TILE_N,
                     int constant_TILE_K,int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int in_stack_00000468;
  int max_kk;
  int max_jj;
  Mat *in_stack_00000470;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_00002410;
  int in_stack_00002414;
  int in_stack_00002418;
  int in_stack_0000241c;
  Mat *in_stack_00002420;
  Mat *in_stack_00002428;
  undefined1 in_stack_000029bb;
  int in_stack_000029bc;
  Mat *in_stack_000029c0;
  Mat *in_stack_000029c8;
  Mat *in_stack_000029d0;
  Mat *in_stack_000029d8;
  Mat *in_stack_000029e0;
  undefined4 in_stack_fffffffffffff524;
  undefined4 in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  int in_stack_fffffffffffff534;
  int in_stack_fffffffffffff538;
  int in_stack_fffffffffffff53c;
  Mat *in_stack_fffffffffffff540;
  undefined8 in_stack_fffffffffffff570;
  void **ppvVar2;
  int in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  int in_stack_fffffffffffff580;
  int in_stack_fffffffffffff584;
  int *in_stack_fffffffffffff590;
  Mat **ppMVar3;
  undefined7 in_stack_fffffffffffff598;
  undefined1 in_stack_fffffffffffff59f;
  int *in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a8;
  void **local_a10;
  int local_96c;
  int local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 local_950;
  undefined4 local_948;
  Allocator *local_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined8 local_920;
  Mat *local_918;
  int *local_910;
  size_t local_908;
  int local_900;
  Allocator *local_8f8;
  undefined4 local_8f0;
  int local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  long local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long *local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  void *local_888;
  int *local_880;
  long local_878;
  undefined4 local_870;
  long *local_868;
  undefined4 local_860;
  int local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  long local_848;
  int local_83c;
  int local_838;
  int local_834;
  void **local_830;
  int local_824;
  int local_820;
  int local_81c;
  void *local_818;
  int *local_810;
  ulong local_808;
  undefined4 local_800;
  long *local_7f8;
  int local_7f0;
  int local_7ec;
  int local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  ulong local_7d8;
  void *local_7d0;
  int *local_7c8;
  void *local_7c0;
  undefined4 local_7b8;
  long *local_7b0;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  void *local_790;
  int local_788;
  int local_784;
  int local_780;
  int local_77c;
  void *local_778;
  int *local_770;
  ulong local_768;
  undefined4 local_760;
  long *local_758;
  int local_750;
  int local_74c;
  int local_748;
  undefined4 local_744;
  undefined4 local_740;
  long local_738;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_710;
  undefined4 local_708;
  Allocator *local_700;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined8 local_6e0;
  Mat local_6d8;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  void *local_668;
  int *local_660;
  size_t local_658;
  int local_650;
  Allocator *local_648;
  undefined4 local_640;
  int local_63c;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  long local_628;
  int local_61c;
  int local_618;
  int local_614;
  int local_610;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  void **local_5f0;
  long *local_5e0;
  void **local_5d8;
  void **local_5d0;
  undefined8 *local_5c8;
  Mat *local_5b8;
  void **local_5a8;
  undefined8 *local_598;
  undefined8 *local_588;
  Mat **local_578;
  void **local_568;
  void **local_558;
  void **local_548;
  void **local_538;
  undefined1 local_525;
  int local_524;
  void **local_520;
  undefined8 *local_518;
  undefined1 local_505;
  int local_504;
  void **local_500;
  void **local_4f8;
  undefined1 local_4e5;
  int local_4e4;
  void **local_4e0;
  undefined8 *local_4d8;
  undefined4 local_4c8;
  int local_4c4;
  undefined8 *local_4c0;
  Mat **local_4b8;
  undefined4 local_4b0;
  int local_4ac;
  undefined8 *local_4a8;
  Mat *local_4a0;
  int local_458;
  undefined4 local_454;
  void **local_450;
  int local_438;
  undefined4 local_434;
  void **local_430;
  int local_418;
  undefined4 local_414;
  void **local_410;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  int local_3d8;
  undefined4 local_3d4;
  Mat **local_3d0;
  undefined8 *local_3b0;
  undefined8 *local_390;
  int local_378;
  undefined4 local_374;
  void **local_370;
  int local_358;
  undefined4 local_354;
  Mat *local_350;
  undefined8 *local_330;
  void **local_320;
  void **local_318;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  Allocator *local_2f8;
  int local_2ec;
  size_t local_2e8;
  void *local_2e0;
  undefined4 local_2d4;
  undefined4 local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  long *local_2c0;
  undefined4 local_2b4;
  ulong local_2b0;
  void *local_2a8;
  undefined4 local_29c;
  int local_298;
  int local_294;
  void **local_290;
  Allocator *local_288;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  size_t in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  
  if (in_stack_00000010 == 0) {
    local_96c = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_968 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_968 = *(int *)(in_RSI + 0x30);
    }
    local_96c = local_968 * *(int *)(in_RSI + 0x18);
  }
  local_604 = local_96c;
  local_600 = in_R9D;
  local_5fc = in_R8D;
  local_5f0 = in_RDX;
  local_5e0 = in_RDI;
  get_optimal_tile_mnk
            (in_stack_fffffffffffff584,in_stack_fffffffffffff580,in_stack_fffffffffffff57c,
             in_stack_fffffffffffff578,(int)((ulong)in_stack_fffffffffffff570 >> 0x20),
             (int)in_stack_fffffffffffff570,in_stack_fffffffffffff590,
             (int *)CONCAT17(in_stack_fffffffffffff59f,in_stack_fffffffffffff598),
             in_stack_fffffffffffff5a0,in_stack_fffffffffffff5a8);
  local_614 = (local_600 + local_608 + -1) / local_608;
  local_618 = (local_604 + local_60c + -1) / local_60c;
  local_61c = (in_stack_00000008 + local_610 + -1) / local_610;
  local_668 = (void *)0x0;
  local_660 = (int *)0x0;
  local_658 = 0;
  local_650 = 0;
  local_648 = (Allocator *)0x0;
  local_640 = 0;
  local_63c = 0;
  local_638 = 0;
  local_634 = 0;
  local_630 = 0;
  local_628 = 0;
  Mat::create(in_stack_fffffffffffff540,in_stack_fffffffffffff53c,in_stack_fffffffffffff538,
              in_stack_fffffffffffff534,
              CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
              (Allocator *)CONCAT44(in_stack_fffffffffffff524,in_stack_00000038));
  local_66c = local_618 * local_61c;
  for (local_670 = 0; local_670 < local_66c; local_670 = local_670 + 1) {
    local_674 = local_670 / local_61c;
    local_678 = local_670 % local_61c;
    local_67c = local_674 * local_60c;
    local_680 = local_678 * local_610;
    local_688 = local_604 - local_67c;
    piVar1 = std::min<int>(&local_688,&local_60c);
    local_684 = *piVar1;
    local_690 = in_stack_00000008 - local_680;
    piVar1 = std::min<int>(&local_690,&local_610);
    local_68c = *piVar1;
    local_4e4 = local_67c / local_60c;
    local_4d8 = &local_720;
    local_4e0 = &local_668;
    local_2e0 = (void *)((long)local_668 + local_628 * local_4e4 * local_658);
    local_2c8 = &local_720;
    local_4ac = local_680 / local_610;
    local_4a0 = &local_6d8;
    local_4a8 = &local_720;
    local_6d8.data = (void *)((long)local_2e0 + (long)local_63c * (long)local_4ac * local_658);
    local_6d8.cstep = (size_t)local_63c;
    local_5c8 = &local_720;
    local_6d8.c = 1;
    local_6d8.d = 1;
    local_6d8.h = 1;
    local_6d8.w = local_63c;
    local_6d8.dims = 2;
    local_6d8.allocator = local_648;
    local_6d8.elempack = local_650;
    local_6d8.elemsize = local_658;
    local_6d8.refcount = (int *)0x0;
    local_700 = local_648;
    local_2cc = local_63c;
    local_2d0 = local_638;
    local_2d4 = local_634;
    local_2e8 = local_658;
    local_2ec = local_650;
    local_2f8 = local_648;
    local_4b0 = 1;
    local_4e5 = 1;
    local_720 = 0;
    local_710 = 0;
    local_708 = 0;
    local_6f8 = 0;
    local_6f4 = 0;
    local_6f0 = 0;
    local_6ec = 0;
    local_6e8 = 0;
    local_6e0 = 0;
    local_718 = 0;
    local_330 = local_5c8;
    if (in_stack_00000010 == 0) {
      transpose_pack_B_tile
                (_k,in_stack_00000470,max_kk,in_stack_00000468,BT_tile.cstep._4_4_,
                 (int)BT_tile.cstep);
    }
    else {
      pack_B_tile(&local_6d8,(Mat *)CONCAT44(local_63c,1),(int)((ulong)local_6d8.data >> 0x20),
                  (int)local_6d8.data,(int)(local_658 >> 0x20),(int)local_658);
    }
    local_5b8 = &local_6d8;
    local_350 = local_5b8;
    if (local_6d8.refcount != (int *)0x0) {
      local_354 = 0xffffffff;
      LOCK();
      local_358 = *local_6d8.refcount;
      *local_6d8.refcount = *local_6d8.refcount + -1;
      UNLOCK();
      if (local_358 == 1) {
        if (local_6d8.allocator == (Allocator *)0x0) {
          if (local_6d8.data != (void *)0x0) {
            free(local_6d8.data);
          }
        }
        else {
          (*(local_6d8.allocator)->_vptr_Allocator[3])(local_6d8.allocator,local_6d8.data);
        }
      }
    }
    local_6d8.data = (void *)0x0;
    local_6d8.elemsize = 0;
    local_6d8.elempack = 0;
    local_6d8.dims = 0;
    local_6d8.w = 0;
    local_6d8.h = 0;
    local_6d8.d = 0;
    local_6d8.c = 0;
    local_6d8.cstep = 0;
    local_6d8.refcount = (int *)0x0;
  }
  local_5d8 = &local_778;
  local_778 = (void *)0x0;
  local_770 = (int *)0x0;
  local_768 = 0;
  local_760 = 0;
  local_758 = (long *)0x0;
  local_750 = 0;
  local_74c = 0;
  local_748 = 0;
  local_744 = 0;
  local_740 = 0;
  local_738 = 0;
  if (((local_610 < in_stack_00000008) || (local_5fc == 3)) || (in_stack_00000018 != 0)) {
    Mat::create(in_stack_fffffffffffff540,in_stack_fffffffffffff53c,in_stack_fffffffffffff538,
                in_stack_fffffffffffff534,
                CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                (Allocator *)CONCAT44(in_stack_fffffffffffff524,in_stack_00000038));
  }
  for (local_77c = 0; local_77c < local_614; local_77c = local_77c + 1) {
    local_780 = local_77c * local_608;
    local_788 = local_600 - local_780;
    piVar1 = std::min<int>(&local_788,&local_608);
    local_784 = *piVar1;
    local_5d0 = &local_7d0;
    local_7d0 = (void *)0x0;
    local_7c8 = (int *)0x0;
    local_7c0 = (void *)0x0;
    local_7b8 = 0;
    local_7b0 = (long *)0x0;
    local_7a8 = 0;
    local_7a4 = 0;
    local_7a0 = 0;
    local_79c = 0;
    local_798 = 0;
    local_790 = (void *)0x0;
    if (((local_610 < in_stack_00000008) || (local_5fc == 3)) || (in_stack_00000018 != 0)) {
      local_504 = get_omp_thread_num();
      local_4f8 = &local_818;
      local_500 = &local_778;
      local_2a8 = (void *)((long)local_778 + local_738 * local_504 * local_768);
      local_290 = &local_818;
      local_818 = local_2a8;
      local_810 = (int *)0x0;
      local_808 = local_768;
      local_800 = local_760;
      local_7f8 = local_758;
      local_7ec = local_74c;
      local_7e8 = local_748;
      local_7e4 = 1;
      local_7e0 = local_744;
      local_7d8 = ((long)local_74c * (long)local_748 * local_768 + 0xf & 0xfffffffffffffff0) /
                  local_768;
      local_7f0 = local_750 + -1;
      if (local_750 == 4) {
        local_7d8 = (long)local_74c * (long)local_748;
      }
      local_294 = local_74c;
      local_298 = local_748;
      local_29c = local_744;
      local_2b0 = local_768;
      local_2b4 = local_760;
      local_2c0 = local_758;
      local_505 = 1;
      local_320 = &local_818;
      local_318 = &local_7d0;
      if (&local_7d0 != local_320) {
        local_300 = &local_7d0;
        if (local_7c8 != (int *)0x0) {
          local_304 = 0xffffffff;
          LOCK();
          local_308 = *local_7c8;
          *local_7c8 = *local_7c8 + -1;
          UNLOCK();
          if (local_308 == 1) {
            if (local_7b0 == (long *)0x0) {
              if (local_7d0 != (void *)0x0) {
                free(local_7d0);
              }
            }
            else {
              (**(code **)(*local_7b0 + 0x18))(local_7b0,local_7d0);
            }
          }
        }
        local_7d0 = (void *)0x0;
        local_7c0 = (void *)0x0;
        local_7b8 = 0;
        local_7a8 = 0;
        local_7a4 = 0;
        local_7a0 = 0;
        local_79c = 0;
        local_798 = 0;
        local_790 = (void *)0x0;
        local_7c8 = (int *)0x0;
        local_7d0 = *local_320;
        local_7c8 = (int *)local_320[1];
        local_7c0 = local_320[2];
        local_7b8 = *(undefined4 *)(local_320 + 3);
        local_7b0 = (long *)local_320[4];
        local_7a8 = *(undefined4 *)(local_320 + 5);
        local_7a4 = *(undefined4 *)((long)local_320 + 0x2c);
        local_7a0 = *(undefined4 *)(local_320 + 6);
        local_79c = *(undefined4 *)((long)local_320 + 0x34);
        local_798 = *(undefined4 *)(local_320 + 7);
        local_790 = local_320[8];
      }
      local_5a8 = &local_818;
      local_370 = local_5a8;
      local_310 = &local_7d0;
      if (local_810 != (int *)0x0) {
        local_374 = 0xffffffff;
        LOCK();
        local_378 = *local_810;
        *local_810 = *local_810 + -1;
        UNLOCK();
        if (local_378 == 1) {
          if (local_7f8 == (long *)0x0) {
            if (local_818 != (void *)0x0) {
              free(local_818);
            }
          }
          else {
            (**(code **)(*local_7f8 + 0x18))(local_7f8,local_818);
          }
        }
      }
      local_818 = (void *)0x0;
      local_808 = 0;
      local_800 = 0;
      local_7f0 = 0;
      local_7ec = 0;
      local_7e8 = 0;
      local_7e4 = 0;
      local_7e0 = 0;
      local_7d8 = 0;
      local_810 = (int *)0x0;
    }
    for (local_81c = 0; local_81c < local_604; local_81c = local_60c + local_81c) {
      local_824 = local_604 - local_81c;
      piVar1 = std::min<int>(&local_824,&local_60c);
      local_820 = *piVar1;
      if (local_5fc == 3) {
        pack_A_tile((Mat *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                    in_stack_fffffffffffffd90,(int)(in_stack_fffffffffffffd88 >> 0x20),
                    (int)in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
                    in_stack_fffffffffffffd80);
      }
      if (local_5fc == 3) {
        local_a10 = &local_7d0;
      }
      else {
        local_a10 = local_5f0;
      }
      local_830 = local_a10;
      for (local_834 = 0; local_834 < in_stack_00000008; local_834 = local_610 + local_834) {
        local_83c = in_stack_00000008 - local_834;
        piVar1 = std::min<int>(&local_83c,&local_610);
        local_838 = *piVar1;
        local_85c = *(int *)((long)local_5e0 + 0x2c);
        local_878 = local_5e0[2];
        local_870 = (undefined4)local_5e0[3];
        local_8b0 = (long *)local_5e0[4];
        local_888 = (void *)(*local_5e0 +
                             local_5e0[8] * (long)(local_780 / local_608) * local_5e0[2] +
                            (long)local_85c * (long)(local_834 / local_610) * local_878);
        local_848 = (long)local_85c;
        local_598 = &local_8d0;
        local_524 = local_81c / local_60c;
        local_518 = &local_960;
        local_520 = &local_668;
        in_stack_fffffffffffffd90 = (Mat *)((long)local_668 + local_628 * local_524 * local_658);
        local_4c4 = local_834 / local_610;
        local_4b8 = &local_918;
        local_4c0 = &local_960;
        local_918 = (Mat *)((long)&in_stack_fffffffffffffd90->data +
                           (long)local_63c * (long)local_4c4 * local_658);
        local_8d8 = (long)local_63c;
        local_588 = &local_960;
        local_850 = 1;
        local_854 = 1;
        local_858 = 1;
        local_860 = 2;
        local_880 = (int *)0x0;
        local_898 = 0;
        local_89c = 0;
        local_8a0 = 0;
        local_8a4 = 0;
        local_8b8 = 0;
        local_8c0 = 0;
        local_8c8 = 0;
        local_8d0 = 0;
        local_8e0 = 1;
        local_8e4 = 1;
        local_8e8 = 1;
        local_8ec = local_63c;
        local_8f0 = 2;
        local_8f8 = local_648;
        local_900 = local_650;
        local_908 = local_658;
        local_910 = (int *)0x0;
        local_940 = local_648;
        local_288 = local_648;
        local_4c8 = 1;
        local_525 = 1;
        local_890 = 0;
        local_8a8 = 0;
        local_960 = 0;
        local_950 = 0;
        local_948 = 0;
        local_938 = 0;
        local_934 = 0;
        local_930 = 0;
        local_92c = 0;
        local_928 = 0;
        local_920 = 0;
        local_958 = 0;
        local_3b0 = local_588;
        local_390 = local_598;
        in_stack_fffffffffffffd84 = local_650;
        in_stack_fffffffffffffd88 = local_658;
        in_stack_fffffffffffffd9c = local_634;
        local_868 = local_8b0;
        gemm_transB_packed_tile
                  (in_stack_000029e0,in_stack_000029d8,in_stack_000029d0,in_stack_000029c8,
                   in_stack_000029c0,in_stack_000029bc,local_784,local_81c,local_820,local_834,
                   local_838,
                   (uint)(in_stack_00000018 == 0 && in_stack_00000008 <= local_834 + local_610),
                   (bool)in_stack_000029bb);
        ppMVar3 = &local_918;
        local_578 = ppMVar3;
        local_3d0 = ppMVar3;
        if (local_910 != (int *)0x0) {
          local_3d4 = 0xffffffff;
          LOCK();
          local_3d8 = *local_910;
          *local_910 = *local_910 + -1;
          UNLOCK();
          if (local_3d8 == 1) {
            if (local_8f8 == (Allocator *)0x0) {
              if (local_918 != (Mat *)0x0) {
                free(local_918);
              }
            }
            else {
              (*local_8f8->_vptr_Allocator[3])(local_8f8,local_918);
            }
          }
        }
        *ppMVar3 = (Mat *)0x0;
        ppMVar3[2] = (Mat *)0x0;
        *(undefined4 *)(ppMVar3 + 3) = 0;
        *(undefined4 *)(ppMVar3 + 5) = 0;
        *(undefined4 *)((long)ppMVar3 + 0x2c) = 0;
        *(undefined4 *)(ppMVar3 + 6) = 0;
        *(undefined4 *)((long)ppMVar3 + 0x34) = 0;
        *(undefined4 *)(ppMVar3 + 7) = 0;
        ppMVar3[8] = (Mat *)0x0;
        ppMVar3[1] = (Mat *)0x0;
        local_568 = &local_888;
        local_3f0 = local_568;
        if (local_880 != (int *)0x0) {
          local_3f4 = 0xffffffff;
          LOCK();
          local_3f8 = *local_880;
          *local_880 = *local_880 + -1;
          UNLOCK();
          if (local_3f8 == 1) {
            if (local_868 == (long *)0x0) {
              if (local_888 != (void *)0x0) {
                free(local_888);
              }
            }
            else {
              (**(code **)(*local_868 + 0x18))(local_868,local_888);
            }
          }
        }
        local_888 = (void *)0x0;
        local_878 = 0;
        local_870 = 0;
        local_860 = 0;
        local_85c = 0;
        local_858 = 0;
        local_854 = 0;
        local_850 = 0;
        local_848 = 0;
        local_880 = (int *)0x0;
      }
      if (in_stack_00000018 != 0) {
        transpose_unpack_output_tile
                  (in_stack_00002428,in_stack_00002420,in_stack_0000241c,in_stack_00002418,
                   in_stack_00002414,in_stack_00002410);
      }
    }
    ppvVar2 = &local_7d0;
    local_558 = ppvVar2;
    local_410 = ppvVar2;
    if (local_7c8 != (int *)0x0) {
      local_414 = 0xffffffff;
      LOCK();
      local_418 = *local_7c8;
      *local_7c8 = *local_7c8 + -1;
      UNLOCK();
      if (local_418 == 1) {
        if (local_7b0 == (long *)0x0) {
          if (local_7d0 != (void *)0x0) {
            free(local_7d0);
          }
        }
        else {
          (**(code **)(*local_7b0 + 0x18))(local_7b0,local_7d0);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  local_548 = &local_778;
  local_430 = local_548;
  if (local_770 != (int *)0x0) {
    local_434 = 0xffffffff;
    LOCK();
    local_438 = *local_770;
    *local_770 = *local_770 + -1;
    UNLOCK();
    if (local_438 == 1) {
      if (local_758 == (long *)0x0) {
        if (local_778 != (void *)0x0) {
          free(local_778);
        }
      }
      else {
        (**(code **)(*local_758 + 0x18))(local_758,local_778);
      }
    }
  }
  local_778 = (void *)0x0;
  local_768 = 0;
  local_760 = 0;
  local_750 = 0;
  local_74c = 0;
  local_748 = 0;
  local_744 = 0;
  local_740 = 0;
  local_738 = 0;
  local_770 = (int *)0x0;
  local_538 = &local_668;
  if (local_660 != (int *)0x0) {
    local_454 = 0xffffffff;
    LOCK();
    local_458 = *local_660;
    *local_660 = *local_660 + -1;
    UNLOCK();
    if (local_458 == 1) {
      local_450 = local_538;
      if (local_648 == (Allocator *)0x0) {
        if (local_668 != (void *)0x0) {
          free(local_668);
        }
      }
      else {
        (*local_648->_vptr_Allocator[3])(local_648,local_668);
      }
    }
  }
  return 0;
}

Assistant:

static int gemm_AT_x86(const Mat& AT, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int K, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}